

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase302::run(TestCase302 *this)

{
  Reader reader;
  undefined8 uVar1;
  undefined8 uVar2;
  PipelineOp *pPVar3;
  Disposer *pDVar4;
  ClientHook *pCVar5;
  CapTableBuilder *pCVar6;
  WirePointer *pWVar7;
  RequestHook *pRVar8;
  Reader *pRVar9;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar10;
  int iVar11;
  Maybe<capnp::MessageSize> *pMVar12;
  bool bVar13;
  Own<capnp::ClientHook> OVar14;
  ReaderFor<Text> RVar15;
  StringPtr methodName;
  StringPtr name;
  StringPtr name_00;
  StringPtr methodName_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  int chainedCallCount;
  Response<capnp::DynamicStruct> response;
  int callCount;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  RemotePromise<capnp::DynamicStruct> promise;
  PipelineFor<capnp::DynamicCapability> outCap;
  WaitScope waitScope;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> pipelineRequest;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  RemotePromise<capnp::DynamicStruct> pipelinePromise;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  EventLoop loop;
  int local_31c;
  Reader local_318;
  int local_2cc;
  undefined1 local_2c8 [8];
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_2c0;
  undefined1 local_278 [40];
  PipelineOp *local_250;
  Disposer *pDStack_248;
  ArrayDisposer *local_240;
  Client local_238;
  PipelineFor<DynamicCapability> local_218;
  EventLoop *local_200;
  undefined4 local_1f8;
  undefined1 local_1f0 [72];
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_1a8;
  undefined1 local_170 [64];
  undefined1 local_130 [12];
  undefined4 uStack_124;
  ClientHook *pCStack_120;
  Disposer *local_100;
  RequestHook *local_f8;
  ArrayPtr<const_char> local_e8;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_d8;
  EventLoop local_a0;
  Maybe<capnp::MessageSize> local_68;
  Maybe<capnp::MessageSize> local_50;
  Maybe<capnp::MessageSize> local_38;
  
  kj::EventLoop::EventLoop(&local_a0);
  local_1f8 = 0xffffffff;
  local_200 = &local_a0;
  kj::EventLoop::enterScope(&local_a0);
  local_2cc = 0;
  local_31c = 0;
  kj::heap<capnp::_::TestPipelineImpl,int&>((kj *)&local_318,&local_2cc);
  local_1f0._0_8_ = local_318._0_8_;
  local_1f0._8_8_ = &(local_318.field_1.anyPointerValue.reader.segment)->ptr;
  if (local_318.field_1._0_8_ == (Server *)0x0) {
    local_1f0._8_8_ = (Server *)0x0;
  }
  local_318.field_1.intValue = 0;
  OVar14 = Capability::Client::makeLocalClient
                     ((Client *)(local_130 + 8),(Own<capnp::Capability::Server> *)local_1f0);
  uVar1 = local_1f0._8_8_;
  if ((Server *)local_1f0._8_8_ != (Server *)0x0) {
    local_1f0._8_8_ = (Server *)0x0;
    (*(_func_int *)(*(RawSchema **)local_1f0._0_8_)->id)
              (local_1f0._0_8_,(char *)(uVar1 + (long)(*(Arena **)uVar1)[-2]._vptr_Arena),OVar14.ptr
              );
  }
  uVar1 = local_318.field_1.intValue;
  local_130._0_8_ = &capnproto_test::capnp::test::TestPipeline::Client::typeinfo;
  local_238.super_Client.hook.disposer._0_4_ = local_130._8_4_;
  local_238.super_Client.hook.disposer._4_4_ = uStack_124;
  local_238.super_Client.hook.ptr = pCStack_120;
  pCStack_120 = (ClientHook *)0x0;
  local_238.schema.super_Schema.raw = (Schema)((long)schemas::s_a5a404caa61d4cd0 + 0x48);
  if (local_318.field_1._0_8_ != (Server *)0x0) {
    local_318.field_1.intValue = 0;
    (*(_func_int *)(*(RawSchema **)local_318._0_8_)->id)
              (local_318._0_8_,
               (char *)(uVar1 + (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena));
  }
  pMVar12 = &local_38;
  local_38.ptr.isSet = false;
  methodName.content.size_ = 7;
  methodName.content.ptr = "getCap";
  DynamicCapability::Client::newRequest
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_130,&local_238,methodName,
             pMVar12);
  iVar11 = (int)pMVar12;
  local_1f0._0_4_ = 3;
  local_1f0._8_8_ = (Server *)0xea;
  name_03.content.size_ = 2;
  name_03.content.ptr = "n";
  DynamicStruct::Builder::set((Builder *)local_130,name_03,(Reader *)local_1f0);
  DynamicValue::Reader::~Reader((Reader *)local_1f0);
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)local_278,&local_31c);
  local_318._0_8_ = local_278._0_8_;
  local_318.field_1.textValue.super_StringPtr.content.ptr =
       (char *)&((SegmentReader *)local_278._8_8_)->ptr;
  if ((SegmentBuilder *)local_278._8_8_ == (SegmentBuilder *)0x0) {
    local_318.field_1.intValue = (int64_t)(SegmentReader *)0x0;
  }
  local_278._8_8_ = (SegmentBuilder *)0x0;
  OVar14 = Capability::Client::makeLocalClient
                     ((Client *)&aStack_2c0,(Own<capnp::Capability::Server> *)&local_318);
  uVar1 = local_318.field_1.textValue.super_StringPtr.content.ptr;
  if (local_318.field_1._0_8_ != (SegmentReader *)0x0) {
    local_318.field_1.intValue = 0;
    (*(_func_int *)(*(RawSchema **)local_318._0_8_)->id)
              (local_318._0_8_,
               (char *)(uVar1 + (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena),OVar14.ptr);
  }
  local_2c8 = (undefined1  [8])&Capability::Client::typeinfo;
  (*(code *)(aStack_2c0.structValue.reader.segment)->arena[4]._vptr_Arena)(&local_318.field_1);
  pRVar9 = (Reader *)local_1f0;
  local_1f0._0_4_ = 0xb;
  local_1f0._8_8_ = local_318.field_1.intValue;
  local_1f0._16_8_ = local_318.field_1.textValue.super_StringPtr.content.size_;
  local_1f0._24_8_ = schemas::s_88eb12a0e0af92b2 + 0x48;
  name_04.content.size_ = 6;
  name_04.content.ptr = "inCap";
  DynamicStruct::Builder::set((Builder *)local_130,name_04,pRVar9);
  DynamicValue::Reader::~Reader((Reader *)local_1f0);
  uVar1 = aStack_2c0.structValue.reader.segment;
  pvVar10 = extraout_RDX;
  if (aStack_2c0._8_8_ != (SegmentReader *)0x0) {
    aStack_2c0.textValue.super_StringPtr.content.size_ = 0;
    (*(code *)(aStack_2c0.anyPointerValue.reader.segment)->arena->_vptr_Arena)
              (aStack_2c0.intValue,
               (_func_int *)
               ((long)&((SegmentReader *)uVar1)->arena +
               (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena));
    pvVar10 = extraout_RDX_00;
  }
  uVar1 = local_278._8_8_;
  if ((SegmentBuilder *)local_278._8_8_ != (SegmentBuilder *)0x0) {
    local_278._8_8_ = (SegmentBuilder *)0x0;
    (*(_func_int *)(*(RawSchema **)local_278._0_8_)->id)
              (local_278._0_8_,
               (long)&((SegmentReader *)uVar1)->arena +
               (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena);
    pvVar10 = extraout_RDX_01;
  }
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_278,(int)local_130,pvVar10
             ,(size_t)pRVar9,iVar11);
  name.content.size_ = 7;
  name.content.ptr = "outBox";
  DynamicStruct::Pipeline::get((Pipeline *)&local_318,(Pipeline *)(local_278 + 0x10),name);
  DynamicValue::Pipeline::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((PipelineFor<DynamicStruct> *)local_2c8,(Pipeline *)&local_318);
  name_00.content.size_ = 4;
  name_00.content.ptr = "cap";
  DynamicStruct::Pipeline::get((Pipeline *)local_1f0,(Pipeline *)local_2c8,name_00);
  DynamicValue::Pipeline::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
            (&local_218,(Pipeline *)local_1f0);
  DynamicValue::Pipeline::~Pipeline((Pipeline *)local_1f0);
  uVar2 = aStack_2c0.listValue.reader.capTable;
  uVar1 = aStack_2c0.listValue.reader.segment;
  if (aStack_2c0.listValue.reader.segment != (SegmentReader *)0x0) {
    aStack_2c0.listValue.reader.segment = (SegmentReader *)0x0;
    aStack_2c0.listValue.reader.capTable = (CapTableReader *)0x0;
    (**(_func_int **)*(WirePointer *)aStack_2c0.listValue.reader.ptr)
              (aStack_2c0.listValue.reader.ptr,uVar1,8,uVar2,uVar2,0);
  }
  uVar1 = aStack_2c0.textValue.super_StringPtr.content.size_;
  if (aStack_2c0._8_8_ != (SegmentReader *)0x0) {
    aStack_2c0.textValue.super_StringPtr.content.size_ = 0;
    (*(code *)(aStack_2c0.anyPointerValue.reader.segment)->arena->_vptr_Arena)
              (aStack_2c0.intValue,
               (_func_int *)
               ((long)&((SegmentReader *)uVar1)->arena +
               (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena));
  }
  DynamicValue::Pipeline::~Pipeline((Pipeline *)&local_318);
  pMVar12 = &local_50;
  local_50.ptr.isSet = false;
  methodName_00.content.size_ = 4;
  methodName_00.content.ptr = "foo";
  DynamicCapability::Client::newRequest
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_1f0,&local_218,
             methodName_00,pMVar12);
  iVar11 = (int)pMVar12;
  pRVar9 = &local_318;
  local_318.type = 3;
  local_318.field_1.intValue = 0x141;
  name_05.content.size_ = 2;
  name_05.content.ptr = "i";
  DynamicStruct::Builder::set((Builder *)local_1f0,name_05,pRVar9);
  DynamicValue::Reader::~Reader(&local_318);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)local_170,(int)local_1f0,__buf,
             (size_t)pRVar9,iVar11);
  (*(local_218.super_Client.hook.ptr)->_vptr_ClientHook[4])((StructSchema *)local_2c8);
  local_318.field_1.intValue = (int64_t)local_2c8;
  local_318.field_1._8_8_ = aStack_2c0.intValue;
  local_318._0_8_ = &capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  local_68.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            (&local_d8,(Client *)&local_318,&local_68);
  uVar1 = local_318.field_1.textValue.super_StringPtr.content.size_;
  pvVar10 = extraout_RDX_02;
  if (local_318.field_1._8_8_ != (Disposer *)0x0) {
    local_318.field_1.textValue.super_StringPtr.content.size_ = 0;
    (**(code **)(local_318.field_1.anyPointerValue.reader.segment)->arena)
              (local_318.field_1.intValue,
               (_func_int *)
               ((long)&((SegmentReader *)uVar1)->arena +
               (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena));
    pvVar10 = extraout_RDX_03;
  }
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send(&local_1a8,(int)&local_d8,pvVar10,(size_t)pRVar9,iVar11);
  local_318._0_8_ = (RawBrandedSchema *)0x0;
  local_318.field_1.intValue = 0;
  local_318.field_1.structValue.reader.segment = (SegmentReader *)(NULL_STRUCT_SCHEMA + 0x48);
  local_318.field_1.listValue.reader.segment = (SegmentReader *)0x0;
  local_318.field_1.listValue.reader.capTable = (CapTableReader *)0x0;
  local_318.field_1.listValue.reader.ptr = (byte *)0x0;
  local_318.field_1._40_8_ = (ArrayDisposer *)0x0;
  local_318.field_1._48_8_ = (undefined8 *)0x0;
  RemotePromise<capnp::DynamicStruct>::operator=
            ((RemotePromise<capnp::DynamicStruct> *)local_278,
             (RemotePromise<capnp::DynamicStruct> *)&local_318);
  uVar2 = local_318.field_1._40_8_;
  uVar1 = local_318.field_1.listValue.reader.ptr;
  if (local_318.field_1.listValue.reader.ptr != (byte *)0x0) {
    local_318.field_1.listValue.reader.ptr = (byte *)0x0;
    local_318.field_1._40_8_ = (ArrayDisposer *)0x0;
    (*(code *)**(undefined8 **)local_318.field_1._48_8_)
              (local_318.field_1._48_8_,uVar1,8,uVar2,uVar2,0);
  }
  uVar1 = local_318.field_1.listValue.reader.capTable;
  if (local_318.field_1._24_8_ != (PipelineOp *)0x0) {
    local_318.field_1.listValue.reader.capTable = (CapTableReader *)0x0;
    (*(code *)(local_318.field_1.listValue.reader.segment)->arena->_vptr_Arena)
              (local_318.field_1.listValue.reader.segment,
               (_func_int *)
               ((long)&((CapTableReader *)uVar1)->_vptr_CapTableReader +
               (long)((CapTableReader *)uVar1)->_vptr_CapTableReader[-2]));
  }
  uVar1 = local_318.field_1.intValue;
  if (local_318.field_1._0_8_ != (Server *)0x0) {
    local_318.field_1.intValue = 0;
    (*(_func_int *)(*(RawSchema **)local_318._0_8_)->id)
              (local_318._0_8_,
               (char *)(uVar1 + (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena));
  }
  if (local_2cc != 0 && kj::_::Debug::minSeverity < 3) {
    local_318._0_8_ = local_318._0_8_ & 0xffffffff00000000;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x148,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_318,&local_2cc);
  }
  if ((local_31c != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_318._0_8_ = local_318._0_8_ & 0xffffffff00000000;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x149,ERROR,
               "\"failed: expected \" \"(0) == (chainedCallCount)\", 0, chainedCallCount",
               (char (*) [43])"failed: expected (0) == (chainedCallCount)",(int *)&local_318,
               &local_31c);
  }
  kj::Promise<capnp::Response<capnp::DynamicStruct>_>::wait
            ((Promise<capnp::Response<capnp::DynamicStruct>_> *)&local_318,local_170);
  name_01.content.size_ = 2;
  name_01.content.ptr = "x";
  DynamicStruct::Reader::get((Reader *)local_2c8,(Reader *)&local_318,name_01);
  RVar15 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)local_2c8);
  bVar13 = true;
  if (RVar15.super_StringPtr.content.size_ == 4) {
    bVar13 = (char)RVar15.super_StringPtr.content.ptr[1] != 'r' ||
             *RVar15.super_StringPtr.content.ptr != 0x6162;
  }
  DynamicValue::Reader::~Reader((Reader *)local_2c8);
  if ((bool)(bVar13 & kj::_::Debug::minSeverity < 3)) {
    name_02.content.size_ = 2;
    name_02.content.ptr = "x";
    DynamicStruct::Reader::get((Reader *)local_2c8,(Reader *)&local_318,name_02);
    local_e8 = (ArrayPtr<const_char>)
               DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)local_2c8)
    ;
    kj::_::Debug::log<char_const(&)[59],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x14c,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response.get(\\\"x\\\").as<Text>())\", \"bar\", response.get(\"x\").as<Text>()"
               ,(char (*) [59])"failed: expected (\"bar\") == (response.get(\"x\").as<Text>())",
               (char (*) [4])0x4e245b,(Reader *)&local_e8);
    DynamicValue::Reader::~Reader((Reader *)local_2c8);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)local_2c8,
             &local_1a8);
  reader._reader.capTable = (CapTableReader *)aStack_2c0.intValue;
  reader._reader.segment = (SegmentReader *)local_2c8;
  reader._reader.data = (void *)aStack_2c0.textValue.super_StringPtr.content.size_;
  reader._reader.pointers = (WirePointer *)aStack_2c0.listValue.reader.segment;
  reader._reader._32_8_ = aStack_2c0.listValue.reader.capTable;
  reader._reader._40_8_ = aStack_2c0.listValue.reader.ptr;
  checkTestMessage(reader);
  if (local_2cc != 3 && kj::_::Debug::minSeverity < 3) {
    local_e8.ptr._0_4_ = 3;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x151,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)&local_e8,&local_2cc);
  }
  if ((local_31c != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_e8.ptr._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x152,ERROR,
               "\"failed: expected \" \"(1) == (chainedCallCount)\", 1, chainedCallCount",
               (char (*) [43])"failed: expected (1) == (chainedCallCount)",(int *)&local_e8,
               &local_31c);
  }
  uVar1 = aStack_2c0._48_8_;
  if (aStack_2c0._48_8_ != (long *)0x0) {
    aStack_2c0._48_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)aStack_2c0._40_8_)
              (aStack_2c0._40_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  uVar1 = local_318.field_1._56_8_;
  if (local_318.field_1._56_8_ != (long *)0x0) {
    local_318.field_1._56_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_318.field_1._48_8_)
              (local_318.field_1._48_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  pDVar4 = local_1a8.hook.disposer;
  uVar1 = local_1a8.super_Builder._builder._32_8_;
  if (local_1a8.super_Builder._builder._32_8_ != 0) {
    local_1a8.super_Builder._builder.dataSize = 0;
    local_1a8.super_Builder._builder.pointerCount = 0;
    local_1a8.super_Builder._builder._38_2_ = 0;
    local_1a8.hook.disposer = (Disposer *)0x0;
    (**(local_1a8.hook.ptr)->_vptr_RequestHook)(local_1a8.hook.ptr,uVar1,8,pDVar4,pDVar4,0);
  }
  pWVar7 = local_1a8.super_Builder._builder.pointers;
  if (local_1a8.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_1a8.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_1a8.super_Builder._builder.data)
              (local_1a8.super_Builder._builder.data,
               (long)&(pWVar7->offsetAndKind).value + *(long *)((long)*pWVar7 + -0x10));
  }
  pCVar6 = local_1a8.super_Builder._builder.capTable;
  if (local_1a8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_1a8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1a8.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_1a8.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar6->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar6->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pRVar8 = local_d8.hook.ptr;
  if (local_d8.hook.ptr != (RequestHook *)0x0) {
    local_d8.hook.ptr = (RequestHook *)0x0;
    (**(local_d8.hook.disposer)->_vptr_Disposer)
              (local_d8.hook.disposer,
               (_func_int *)((long)&pRVar8->_vptr_RequestHook + (long)pRVar8->_vptr_RequestHook[-2])
              );
  }
  uVar2 = local_170._48_8_;
  uVar1 = local_170._40_8_;
  if (local_170._40_8_ != 0) {
    local_170._40_8_ = 0;
    local_170._48_8_ = (Disposer *)0x0;
    (***(_func_int ***)local_170._56_8_)(local_170._56_8_,uVar1,8,uVar2,uVar2,0);
  }
  uVar1 = local_170._32_8_;
  if ((WirePointer *)local_170._32_8_ != (WirePointer *)0x0) {
    local_170._32_8_ = (WirePointer *)0x0;
    (*(code *)**(undefined8 **)local_170._24_8_)
              (local_170._24_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar1)->value +
               *(long *)((long)*(WirePointer *)uVar1 + -0x10));
  }
  uVar1 = local_170._8_8_;
  if ((SegmentBuilder *)local_170._8_8_ != (SegmentBuilder *)0x0) {
    local_170._8_8_ = (SegmentBuilder *)0x0;
    (*(code *)(*(RawSchema **)local_170._0_8_)->id)
              (local_170._0_8_,
               (long)&((SegmentReader *)uVar1)->arena +
               (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena);
  }
  uVar1 = local_1f0._56_8_;
  if ((long *)local_1f0._56_8_ != (long *)0x0) {
    local_1f0._56_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_1f0._48_8_)
              (local_1f0._48_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  pCVar5 = local_218.super_Client.hook.ptr;
  if (local_218.super_Client.hook.ptr != (ClientHook *)0x0) {
    local_218.super_Client.hook.ptr = (ClientHook *)0x0;
    (**(local_218.super_Client.hook.disposer)->_vptr_Disposer)
              (local_218.super_Client.hook.disposer,
               (_func_int *)((long)&pCVar5->_vptr_ClientHook + (long)pCVar5->_vptr_ClientHook[-2]));
  }
  pDVar4 = pDStack_248;
  pPVar3 = local_250;
  if (local_250 != (PipelineOp *)0x0) {
    local_250 = (PipelineOp *)0x0;
    pDStack_248 = (Disposer *)0x0;
    (**local_240->_vptr_ArrayDisposer)(local_240,pPVar3,8,pDVar4,pDVar4,0);
  }
  uVar1 = local_278._32_8_;
  if ((WirePointer *)local_278._32_8_ != (WirePointer *)0x0) {
    local_278._32_8_ = (WirePointer *)0x0;
    (***(_func_int ***)local_278._24_8_)
              (local_278._24_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar1)->value +
               *(long *)((long)*(WirePointer *)uVar1 + -0x10));
  }
  uVar1 = local_278._8_8_;
  if ((SegmentBuilder *)local_278._8_8_ != (SegmentBuilder *)0x0) {
    local_278._8_8_ = (SegmentBuilder *)0x0;
    (*(_func_int *)(*(RawSchema **)local_278._0_8_)->id)
              (local_278._0_8_,
               (long)&((SegmentReader *)uVar1)->arena +
               (long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena);
  }
  pRVar8 = local_f8;
  if (local_f8 != (RequestHook *)0x0) {
    local_f8 = (RequestHook *)0x0;
    (**local_100->_vptr_Disposer)
              (local_100,
               (_func_int *)((long)&pRVar8->_vptr_RequestHook + (long)pRVar8->_vptr_RequestHook[-2])
              );
  }
  pCVar5 = local_238.super_Client.hook.ptr;
  if (local_238.super_Client.hook.ptr != (ClientHook *)0x0) {
    local_238.super_Client.hook.ptr = (ClientHook *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_238.super_Client.hook.disposer._4_4_,
                         local_238.super_Client.hook.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(local_238.super_Client.hook.disposer._4_4_,
                        local_238.super_Client.hook.disposer._0_4_),
               (_func_int *)
               ((long)&((CapTableReader *)&pCVar5->_vptr_ClientHook)->_vptr_CapTableReader +
               (long)((CapTableReader *)&pCVar5->_vptr_ClientHook)->_vptr_CapTableReader[-2]));
  }
  kj::EventLoop::leaveScope(local_200);
  kj::EventLoop::~EventLoop(&local_a0);
  return;
}

Assistant:

TEST(Capability, DynamicClientPipelining) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  int chainedCallCount = 0;
  DynamicCapability::Client client =
      test::TestPipeline::Client(kj::heap<TestPipelineImpl>(callCount));

  auto request = client.newRequest("getCap");
  request.set("n", 234);
  request.set("inCap", test::TestInterface::Client(kj::heap<TestInterfaceImpl>(chainedCallCount)));

  auto promise = request.send();

  auto outCap = promise.get("outBox").releaseAs<DynamicStruct>()
                       .get("cap").releaseAs<DynamicCapability>();
  auto pipelineRequest = outCap.newRequest("foo");
  pipelineRequest.set("i", 321);
  auto pipelinePromise = pipelineRequest.send();

  auto pipelineRequest2 = outCap.castAs<test::TestExtends>().graultRequest();
  auto pipelinePromise2 = pipelineRequest2.send();

  promise = nullptr;  // Just to be annoying, drop the original promise.

  EXPECT_EQ(0, callCount);
  EXPECT_EQ(0, chainedCallCount);

  auto response = pipelinePromise.wait(waitScope);
  EXPECT_EQ("bar", response.get("x").as<Text>());

  auto response2 = pipelinePromise2.wait(waitScope);
  checkTestMessage(response2);

  EXPECT_EQ(3, callCount);
  EXPECT_EQ(1, chainedCallCount);
}